

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff.cxx
# Opt level: O2

unique_ptr<vigra::Decoder,_std::default_delete<vigra::Decoder>_> __thiscall
vigra::TIFFCodecFactory::getDecoder(TIFFCodecFactory *this)

{
  TIFFDecoder *this_00;
  
  TIFFSetWarningHandler(vigraWarningHandler);
  this_00 = (TIFFDecoder *)operator_new(0x30);
  TIFFDecoder::TIFFDecoder(this_00);
  (this->super_CodecFactory)._vptr_CodecFactory = (_func_int **)this_00;
  return (__uniq_ptr_data<vigra::Decoder,_std::default_delete<vigra::Decoder>,_true,_true>)
         (__uniq_ptr_data<vigra::Decoder,_std::default_delete<vigra::Decoder>,_true,_true>)this;
}

Assistant:

VIGRA_UNIQUE_PTR<Decoder> TIFFCodecFactory::getDecoder() const
    {
        // use 'NULL' to silence all warnings
        TIFFSetWarningHandler((TIFFErrorHandler)&vigraWarningHandler);

        return VIGRA_UNIQUE_PTR<Decoder>( new TIFFDecoder() );
    }